

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void ArgmaxTask::run(search *sch,multi_ex *ec)

{
  size_type sVar1;
  reference ppeVar2;
  float *pfVar3;
  ulong uVar4;
  stringstream *psVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  float unaff_retaddr;
  ptag *in_stack_00000008;
  size_t in_stack_00000010;
  action *in_stack_00000018;
  ptag in_stack_00000024;
  example *in_stack_00000028;
  search *in_stack_00000030;
  float loss;
  uint32_t prediction;
  uint32_t oracle;
  ptag i_1;
  size_t i;
  uint32_t max_label;
  uint32_t max_prediction;
  task_data *D;
  undefined8 in_stack_ffffffffffffff78;
  float loss_00;
  search *in_stack_ffffffffffffff80;
  float local_4c;
  action local_34;
  float local_30;
  uint local_2c;
  ulong local_28;
  float local_20;
  float local_1c;
  task_data *local_18;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  search *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = Search::search::get_task_data<ArgmaxTask::task_data>(in_RDI);
  local_1c = 1.4013e-45;
  local_20 = 1.4013e-45;
  for (local_28 = 0; uVar4 = local_28,
      sVar1 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10), uVar4 < sVar1;
      local_28 = local_28 + 1) {
    ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_28);
    pfVar3 = (float *)std::max<unsigned_int>((uint *)&((*ppeVar2)->l).empty,(uint *)&local_20);
    local_20 = *pfVar3;
  }
  local_2c = 0;
  while( true ) {
    loss_00 = (float)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    uVar4 = (ulong)local_2c;
    sVar1 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
    if (sVar1 <= uVar4) break;
    if ((local_18->predict_max & 1U) == 0) {
      ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (local_10,(ulong)local_2c);
      local_4c = ((*ppeVar2)->l).simple.label;
    }
    else {
      local_4c = local_20;
    }
    local_30 = local_4c;
    std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,(ulong)local_2c);
    in_stack_ffffffffffffff78 = 0;
    in_stack_ffffffffffffff80 = (search *)0x0;
    local_34 = Search::search::predict
                         (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018,
                          in_stack_00000010,in_stack_00000008,(char *)i,_max_label,(size_t)D,
                          (float *)ec,(size_t)sch,unaff_retaddr);
    pfVar3 = (float *)std::max<unsigned_int>(&local_34,(uint *)&local_1c);
    local_1c = *pfVar3;
    local_2c = local_2c + 1;
  }
  Search::search::loss(in_stack_ffffffffffffff80,loss_00);
  Search::search::output_abi_cxx11_(local_8);
  uVar4 = std::ios::good();
  if ((uVar4 & 1) != 0) {
    psVar5 = Search::search::output_abi_cxx11_(local_8);
    std::ostream::operator<<(psVar5 + 0x10,(uint)local_1c);
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  uint32_t max_prediction = 1;
  uint32_t max_label = 1;

  for (size_t i = 0; i < ec.size(); i++) max_label = max(ec[i]->l.multi.label, max_label);

  for (ptag i = 0; i < ec.size(); i++)
  {
    // labels should be 1 or 2, and our output is MAX of all predicted values
    uint32_t oracle = D.predict_max ? max_label : ec[i]->l.multi.label;
    uint32_t prediction = sch.predict(*ec[i], i + 1, &oracle, 1, &i, "p");

    max_prediction = max(prediction, max_prediction);
  }
  float loss = 0.;
  if (max_label > max_prediction)
    loss = D.false_negative_cost / D.negative_weight;
  else if (max_prediction > max_label)
    loss = 1.;
  sch.loss(loss);

  if (sch.output().good())
    sch.output() << max_prediction;
}